

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int freePage2(BtShared *pBt,MemPage *pMemPage,Pgno iPage)

{
  int flags;
  u32 uVar1;
  Pgno in_EDX;
  BtShared *in_RSI;
  long in_RDI;
  u32 nLeaf;
  int nFree;
  int rc;
  MemPage *pPage;
  MemPage *pPage1;
  Pgno iTrunk;
  MemPage *pTrunk;
  undefined4 in_stack_ffffffffffffffb8;
  u32 in_stack_ffffffffffffffbc;
  Pgno in_stack_ffffffffffffffc4;
  BtShared *in_stack_ffffffffffffffc8;
  long lVar2;
  undefined4 in_stack_ffffffffffffffd8;
  u32 v;
  long lVar3;
  u8 in_stack_ffffffffffffffeb;
  BtShared *pBVar4;
  
  lVar3 = 0;
  v = 0;
  lVar2 = *(long *)(in_RDI + 0x18);
  pBVar4 = in_RSI;
  if (in_RSI == (BtShared *)0x0) {
    in_RSI = (BtShared *)btreePageLookup(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4);
  }
  else {
    sqlite3PagerRef((DbPage *)0x152191);
  }
  flags = sqlite3PagerWrite((PgHdr *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  if (flags != 0) goto LAB_0015244b;
  uVar1 = sqlite3Get4byte((u8 *)(*(long *)(lVar2 + 0x50) + 0x24));
  sqlite3Put4byte((uchar *)(*(long *)(lVar2 + 0x50) + 0x24),uVar1 + 1);
  if ((*(ushort *)(in_RDI + 0x26) & 4) != 0) {
    if (((in_RSI == (BtShared *)0x0) &&
        (flags = btreeGetPage((BtShared *)CONCAT44(v,in_stack_ffffffffffffffd8),
                              (Pgno)((ulong)lVar2 >> 0x20),(MemPage **)0x0,flags), flags != 0)) ||
       (flags = sqlite3PagerWrite((PgHdr *)CONCAT44(in_stack_ffffffffffffffbc,
                                                    in_stack_ffffffffffffffb8)), flags != 0))
    goto LAB_0015244b;
    memset(in_RSI->mutex,0,(ulong)((BtShared *)in_RSI->xFreeSchema)->pageSize);
  }
  if (*(char *)(in_RDI + 0x21) != '\0') {
    ptrmapPut(pBVar4,in_EDX,in_stack_ffffffffffffffeb,(Pgno)((ulong)lVar3 >> 0x20),
              (int *)CONCAT44(v,in_stack_ffffffffffffffd8));
    if (flags != 0) goto LAB_0015244b;
    flags = 0;
  }
  if (uVar1 != 0) {
    v = sqlite3Get4byte((u8 *)(*(long *)(lVar2 + 0x50) + 0x20));
    flags = btreeGetPage((BtShared *)CONCAT44(v,in_stack_ffffffffffffffd8),
                         (Pgno)((ulong)lVar2 >> 0x20),(MemPage **)in_RSI,flags);
    if (flags != 0) goto LAB_0015244b;
    in_stack_ffffffffffffffbc = sqlite3Get4byte((u8 *)(*(long *)(lVar3 + 0x50) + 4));
    if ((*(uint *)(in_RDI + 0x34) >> 2) - 2 < in_stack_ffffffffffffffbc) {
      flags = sqlite3CorruptError(0);
      goto LAB_0015244b;
    }
    if (in_stack_ffffffffffffffbc < (*(uint *)(in_RDI + 0x34) >> 2) - 8) {
      flags = sqlite3PagerWrite((PgHdr *)CONCAT44(in_stack_ffffffffffffffbc,
                                                  in_stack_ffffffffffffffb8));
      if (flags == 0) {
        sqlite3Put4byte((uchar *)(*(long *)(lVar3 + 0x50) + 4),in_stack_ffffffffffffffbc + 1);
        sqlite3Put4byte((uchar *)(*(long *)(lVar3 + 0x50) +
                                 (ulong)(in_stack_ffffffffffffffbc * 4 + 8)),in_EDX);
        if ((in_RSI != (BtShared *)0x0) && ((*(ushort *)(in_RDI + 0x26) & 4) == 0)) {
          sqlite3PagerDontWrite((PgHdr *)in_RSI->pNext);
        }
        flags = btreeSetHasContent((BtShared *)CONCAT44(flags,uVar1),in_stack_ffffffffffffffbc);
      }
      goto LAB_0015244b;
    }
  }
  if (((in_RSI != (BtShared *)0x0) ||
      (flags = btreeGetPage((BtShared *)CONCAT44(v,in_stack_ffffffffffffffd8),
                            (Pgno)((ulong)lVar2 >> 0x20),(MemPage **)0x0,flags), flags == 0)) &&
     (flags = sqlite3PagerWrite((PgHdr *)CONCAT44(in_stack_ffffffffffffffbc,
                                                  in_stack_ffffffffffffffb8)), flags == 0)) {
    sqlite3Put4byte((uchar *)in_RSI->mutex,v);
    sqlite3Put4byte((uchar *)&(in_RSI->mutex->mutex).__data.__count,0);
    sqlite3Put4byte((uchar *)(*(long *)(lVar2 + 0x50) + 0x20),in_EDX);
  }
LAB_0015244b:
  if (in_RSI != (BtShared *)0x0) {
    *(u8 *)&in_RSI->pPager = '\0';
  }
  releasePage((MemPage *)0x152465);
  releasePage((MemPage *)0x15246f);
  return flags;
}

Assistant:

static int freePage2(BtShared *pBt, MemPage *pMemPage, Pgno iPage){
  MemPage *pTrunk = 0;                /* Free-list trunk page */
  Pgno iTrunk = 0;                    /* Page number of free-list trunk page */ 
  MemPage *pPage1 = pBt->pPage1;      /* Local reference to page 1 */
  MemPage *pPage;                     /* Page being freed. May be NULL. */
  int rc;                             /* Return Code */
  int nFree;                          /* Initial number of pages on free-list */

  assert( sqlite3_mutex_held(pBt->mutex) );
  assert( iPage>1 );
  assert( !pMemPage || pMemPage->pgno==iPage );

  if( pMemPage ){
    pPage = pMemPage;
    sqlite3PagerRef(pPage->pDbPage);
  }else{
    pPage = btreePageLookup(pBt, iPage);
  }

  /* Increment the free page count on pPage1 */
  rc = sqlite3PagerWrite(pPage1->pDbPage);
  if( rc ) goto freepage_out;
  nFree = get4byte(&pPage1->aData[36]);
  put4byte(&pPage1->aData[36], nFree+1);

  if( pBt->btsFlags & BTS_SECURE_DELETE ){
    /* If the secure_delete option is enabled, then
    ** always fully overwrite deleted information with zeros.
    */
    if( (!pPage && ((rc = btreeGetPage(pBt, iPage, &pPage, 0))!=0) )
     ||            ((rc = sqlite3PagerWrite(pPage->pDbPage))!=0)
    ){
      goto freepage_out;
    }
    memset(pPage->aData, 0, pPage->pBt->pageSize);
  }

  /* If the database supports auto-vacuum, write an entry in the pointer-map
  ** to indicate that the page is free.
  */
  if( ISAUTOVACUUM ){
    ptrmapPut(pBt, iPage, PTRMAP_FREEPAGE, 0, &rc);
    if( rc ) goto freepage_out;
  }

  /* Now manipulate the actual database free-list structure. There are two
  ** possibilities. If the free-list is currently empty, or if the first
  ** trunk page in the free-list is full, then this page will become a
  ** new free-list trunk page. Otherwise, it will become a leaf of the
  ** first trunk page in the current free-list. This block tests if it
  ** is possible to add the page as a new free-list leaf.
  */
  if( nFree!=0 ){
    u32 nLeaf;                /* Initial number of leaf cells on trunk page */

    iTrunk = get4byte(&pPage1->aData[32]);
    rc = btreeGetPage(pBt, iTrunk, &pTrunk, 0);
    if( rc!=SQLITE_OK ){
      goto freepage_out;
    }

    nLeaf = get4byte(&pTrunk->aData[4]);
    assert( pBt->usableSize>32 );
    if( nLeaf > (u32)pBt->usableSize/4 - 2 ){
      rc = SQLITE_CORRUPT_BKPT;
      goto freepage_out;
    }
    if( nLeaf < (u32)pBt->usableSize/4 - 8 ){
      /* In this case there is room on the trunk page to insert the page
      ** being freed as a new leaf.
      **
      ** Note that the trunk page is not really full until it contains
      ** usableSize/4 - 2 entries, not usableSize/4 - 8 entries as we have
      ** coded.  But due to a coding error in versions of SQLite prior to
      ** 3.6.0, databases with freelist trunk pages holding more than
      ** usableSize/4 - 8 entries will be reported as corrupt.  In order
      ** to maintain backwards compatibility with older versions of SQLite,
      ** we will continue to restrict the number of entries to usableSize/4 - 8
      ** for now.  At some point in the future (once everyone has upgraded
      ** to 3.6.0 or later) we should consider fixing the conditional above
      ** to read "usableSize/4-2" instead of "usableSize/4-8".
      **
      ** EVIDENCE-OF: R-19920-11576 However, newer versions of SQLite still
      ** avoid using the last six entries in the freelist trunk page array in
      ** order that database files created by newer versions of SQLite can be
      ** read by older versions of SQLite.
      */
      rc = sqlite3PagerWrite(pTrunk->pDbPage);
      if( rc==SQLITE_OK ){
        put4byte(&pTrunk->aData[4], nLeaf+1);
        put4byte(&pTrunk->aData[8+nLeaf*4], iPage);
        if( pPage && (pBt->btsFlags & BTS_SECURE_DELETE)==0 ){
          sqlite3PagerDontWrite(pPage->pDbPage);
        }
        rc = btreeSetHasContent(pBt, iPage);
      }
      TRACE(("FREE-PAGE: %d leaf on trunk page %d\n",pPage->pgno,pTrunk->pgno));
      goto freepage_out;
    }
  }

  /* If control flows to this point, then it was not possible to add the
  ** the page being freed as a leaf page of the first trunk in the free-list.
  ** Possibly because the free-list is empty, or possibly because the 
  ** first trunk in the free-list is full. Either way, the page being freed
  ** will become the new first trunk page in the free-list.
  */
  if( pPage==0 && SQLITE_OK!=(rc = btreeGetPage(pBt, iPage, &pPage, 0)) ){
    goto freepage_out;
  }
  rc = sqlite3PagerWrite(pPage->pDbPage);
  if( rc!=SQLITE_OK ){
    goto freepage_out;
  }
  put4byte(pPage->aData, iTrunk);
  put4byte(&pPage->aData[4], 0);
  put4byte(&pPage1->aData[32], iPage);
  TRACE(("FREE-PAGE: %d new trunk page replacing %d\n", pPage->pgno, iTrunk));

freepage_out:
  if( pPage ){
    pPage->isInit = 0;
  }
  releasePage(pPage);
  releasePage(pTrunk);
  return rc;
}